

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre_test.cc
# Opt level: O3

bool CompilationFails(string_view str)

{
  size_type *psVar1;
  long lVar2;
  undefined1 uVar3;
  undefined8 uVar4;
  long *local_b0 [2];
  long local_a0 [2];
  undefined1 local_90 [16];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_80;
  bool local_60;
  size_t local_58;
  size_type *local_48;
  string result;
  
  local_90[0] = 0;
  trivialre::re_compiler::
  C<StringTestingBuilder,CompilationFails(std::basic_string_view<char,std::char_traits<char>>)::Policy>
  ::ParseAlt_abi_cxx11_((ParseResult *)&local_80,local_90,str);
  if (local_58 != 0) {
    local_90[0] = 1;
  }
  psVar1 = &result._M_string_length;
  local_48 = psVar1;
  if (local_60 == false) {
    result._M_string_length._4_1_ = 0x3e;
    result._M_string_length._0_4_ = 0x796e613c;
    result._M_dataplus._M_p = (pointer)0x5;
    result._M_string_length._5_1_ = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,local_80._M_value._M_dataplus._M_p,
               (pointer)(local_80._M_value._M_string_length +
                        (long)local_80._M_value._M_dataplus._M_p));
  }
  lVar2 = (long)&local_80._M_value + 0x10;
  if ((local_60 & 1U) != 0) {
    local_60 = false;
    if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)lVar2) {
      operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
    }
  }
  local_80._M_value._M_dataplus._M_p = (_Alloc_hider)lVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,str._M_str,str._M_str + str._M_len);
  uVar4 = local_80._M_value._M_dataplus._M_p;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,local_48,result._M_dataplus._M_p + (long)local_48);
  printf("for failing: %s -> %s\n",uVar4,local_b0[0]);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_80._M_value._M_dataplus._M_p != (_Alloc_hider)lVar2) {
    operator_delete((void *)local_80._M_value._M_dataplus._M_p,local_80._16_8_ + 1);
  }
  uVar3 = local_90[0];
  if (local_48 != psVar1) {
    operator_delete(local_48,CONCAT26(result._M_string_length._6_2_,
                                      CONCAT15(result._M_string_length._5_1_,
                                               CONCAT14(result._M_string_length._4_1_,
                                                        (undefined4)result._M_string_length))) + 1);
  }
  return (bool)uVar3;
}

Assistant:

bool CompilationFails(std::string_view str) {
  struct Policy {
    bool failed{};
    void NoteError(std::string_view msg, std::string_view at) { failed = true; }
    void StartedParsing(std::string_view str) {}
  };
  trivialre::re_compiler::C<StringTestingBuilder, Policy> compiler({});
  std::string result = compiler.CompileOrDie(str);
  printf("for failing: %s -> %s\n", std::string(str).c_str(), std::string(result).c_str());
  return compiler.failed;
}